

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O3

bool __thiscall
CLOParser::getOption<int>(CLOParser *this,char *names,int *pResult,bool fValueOptional)

{
  char *__s;
  string *psVar1;
  int iVar2;
  istream *piVar3;
  long *plVar4;
  int iVar5;
  int tmp;
  string keyword;
  string arg;
  istringstream iss_1;
  istringstream iss;
  int local_374;
  undefined1 *local_370;
  string *local_368;
  undefined1 local_360 [16];
  undefined1 *local_350;
  string *local_348;
  undefined1 local_340 [16];
  undefined1 *local_330 [2];
  undefined1 local_320 [104];
  ios_base local_2b8 [264];
  allocator local_1b0 [120];
  ios_base local_138 [264];
  
  if (*this->i < this->argc) {
    std::__cxx11::string::string((string *)&local_350,this->argv[*this->i],local_1b0);
    local_370 = local_360;
    local_368 = (string *)0x0;
    local_360[0] = 0;
    std::__cxx11::string::string((string *)local_330,names,(allocator *)&local_374);
    std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)local_330,_S_in)
    ;
    if (local_330[0] != local_320) {
      operator_delete(local_330[0]);
    }
    do {
      do {
        piVar3 = std::operator>>((istream *)local_1b0,(string *)&local_370);
        psVar1 = local_368;
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
          fValueOptional = false;
          goto LAB_001bd8aa;
        }
      } while (((pResult == (int *)0x0 || (string *)0x2 < local_368) &&
               ((local_348 != local_368 ||
                ((local_368 != (string *)0x0 &&
                 (iVar2 = bcmp(local_350,local_370,(size_t)local_368), iVar2 != 0)))))) ||
              (iVar2 = std::__cxx11::string::compare((ulong)&local_350,0,psVar1), iVar2 != 0));
      if (local_348 <= local_368) {
        if (pResult == (int *)0x0) {
          fValueOptional = true;
          goto LAB_001bd8aa;
        }
        iVar2 = *this->i;
        iVar5 = iVar2 + 1;
        *this->i = iVar5;
        if (this->argc <= iVar5) goto LAB_001bd8aa;
        __s = this->argv[(long)iVar2 + 1];
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_350,0,(char *)local_348,(ulong)__s);
        goto LAB_001bd842;
      }
    } while (pResult == (int *)0x0);
    std::__cxx11::string::erase((ulong)&local_350,0);
LAB_001bd842:
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_330,(string *)&local_350,_S_in);
    plVar4 = (long *)std::istream::operator>>((istream *)local_330,&local_374);
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
      *pResult = local_374;
      fValueOptional = true;
    }
    else {
      *this->i = *this->i + -1;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_330);
    std::ios_base::~ios_base(local_2b8);
LAB_001bd8aa:
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
    if (local_370 != local_360) {
      operator_delete(local_370);
    }
    if (local_350 != local_340) {
      operator_delete(local_350);
    }
  }
  else {
    fValueOptional = false;
  }
  return fValueOptional;
}

Assistant:

inline bool getOption(const char* names,           // space-separated option list
												Value* pResult = nullptr,    // pointer to value storage
												bool fValueOptional = false  // if pResult, for non-string values
	) {
		assert(nullptr == strchr(names, ','));
		assert(nullptr == strchr(names, ';'));
		if (i >= argc) {
			return false;
		}
		assert(argv[i]);
		std::string arg(argv[i]);
		/// Separate keywords
		std::string keyword;
		std::istringstream iss(names);
		while (iss >> keyword) {
			if (((2 < keyword.size() || nullptr == pResult) && arg != keyword) ||  // exact cmp
					(0 != arg.compare(0, keyword.size(), keyword))) {                  // truncated cmp
				continue;
			}
			/// Process it
			if (keyword.size() < arg.size()) {
				if (nullptr == pResult) {
					continue;
				}
				arg.erase(0, keyword.size());
			} else {
				if (nullptr == pResult) {
					return true;
				}
				i++;
				if (i >= argc) {
					return fValueOptional;
				}
				arg = argv[i];
			}
			assert(pResult);
			if (assignStr(pResult, arg)) {
				return true;
			}
			std::istringstream iss(arg);  // NOLINT
			Value tmp;
			if (!(iss >> tmp)) {
				--i;
				if (fValueOptional) {
					return true;
				}
				// Not print because another agent can handle this option
				//           cerr << "\nBad value for " << keyword << ": " << arg << endl;
				return false;
			}
			*pResult = tmp;
			return true;
		}
		return false;
	}